

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O0

void __thiscall helics::BrokerApp::BrokerApp(BrokerApp *this,shared_ptr<helics::Broker> *brk)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  __shared_ptr *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  shared_ptr<helics::Broker> *in_stack_ffffffffffffffc8;
  shared_ptr<helics::Broker> *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  CLI::std::shared_ptr<helics::Broker>::shared_ptr
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x10);
  std::__cxx11::string::string(in_stack_ffffffffffffffe0);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDI);
  if (bVar1) {
    peVar3 = CLI::std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x42097a);
    iVar2 = (*peVar3->_vptr_Broker[0xb])();
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var,iVar2));
  }
  return;
}

Assistant:

BrokerApp::BrokerApp(std::shared_ptr<Broker> brk): broker(std::move(brk))
{
    if (broker) {
        name = broker->getIdentifier();
    }
}